

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preset.cpp
# Opt level: O3

void __thiscall sf2cute::SFPreset::SFPreset(SFPreset *this,SFPreset *origin)

{
  pointer pcVar1;
  SFPresetZone *pSVar2;
  pointer puVar3;
  uint16_t uVar4;
  uint32_t uVar5;
  SFPresetZone *this_00;
  tuple<sf2cute::SFPresetZone_*,_std::default_delete<sf2cute::SFPresetZone>_> this_01;
  pointer puVar6;
  __uniq_ptr_impl<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_> local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_38 = &(this->name_).field_2;
  (this->name_)._M_dataplus._M_p = (pointer)local_38;
  pcVar1 = (origin->name_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + (origin->name_)._M_string_length);
  uVar4 = origin->bank_;
  this->preset_number_ = origin->preset_number_;
  this->bank_ = uVar4;
  uVar5 = origin->genre_;
  this->library_ = origin->library_;
  this->genre_ = uVar5;
  this->morphology_ = origin->morphology_;
  (this->zones_).
  super__Vector_base<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->zones_).
  super__Vector_base<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->zones_).
  super__Vector_base<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->global_zone_)._M_t.
  super___uniq_ptr_impl<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>._M_t.
  super__Tuple_impl<0UL,_sf2cute::SFPresetZone_*,_std::default_delete<sf2cute::SFPresetZone>_>.
  super__Head_base<0UL,_sf2cute::SFPresetZone_*,_false>._M_head_impl = (SFPresetZone *)0x0;
  this->parent_file_ = (SoundFont *)0x0;
  pSVar2 = (origin->global_zone_)._M_t.
           super___uniq_ptr_impl<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>
           ._M_t.
           super__Tuple_impl<0UL,_sf2cute::SFPresetZone_*,_std::default_delete<sf2cute::SFPresetZone>_>
           .super__Head_base<0UL,_sf2cute::SFPresetZone_*,_false>._M_head_impl;
  if (pSVar2 != (SFPresetZone *)0x0) {
    this_00 = (SFPresetZone *)operator_new(0x50);
    SFPresetZone::SFPresetZone(this_00,pSVar2);
    pSVar2 = (this->global_zone_)._M_t.
             super___uniq_ptr_impl<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>
             ._M_t.
             super__Tuple_impl<0UL,_sf2cute::SFPresetZone_*,_std::default_delete<sf2cute::SFPresetZone>_>
             .super__Head_base<0UL,_sf2cute::SFPresetZone_*,_false>._M_head_impl;
    (this->global_zone_)._M_t.
    super___uniq_ptr_impl<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>._M_t.
    super__Tuple_impl<0UL,_sf2cute::SFPresetZone_*,_std::default_delete<sf2cute::SFPresetZone>_>.
    super__Head_base<0UL,_sf2cute::SFPresetZone_*,_false>._M_head_impl = this_00;
    if (pSVar2 != (SFPresetZone *)0x0) {
      (**(code **)((long)(pSVar2->super_SFZone)._vptr_SFZone + 8))();
    }
  }
  std::
  vector<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>_>_>
  ::reserve(&this->zones_,
            (long)(origin->zones_).
                  super__Vector_base<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(origin->zones_).
                  super__Vector_base<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3);
  puVar6 = (origin->zones_).
           super__Vector_base<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (origin->zones_).
           super__Vector_base<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar6 != puVar3) {
    do {
      pSVar2 = (puVar6->_M_t).
               super___uniq_ptr_impl<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>
               ._M_t.
               super__Tuple_impl<0UL,_sf2cute::SFPresetZone_*,_std::default_delete<sf2cute::SFPresetZone>_>
               .super__Head_base<0UL,_sf2cute::SFPresetZone_*,_false>._M_head_impl;
      this_01.
      super__Tuple_impl<0UL,_sf2cute::SFPresetZone_*,_std::default_delete<sf2cute::SFPresetZone>_>.
      super__Head_base<0UL,_sf2cute::SFPresetZone_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_sf2cute::SFPresetZone_*,_std::default_delete<sf2cute::SFPresetZone>_>)
           operator_new(0x50);
      SFPresetZone::SFPresetZone
                ((SFPresetZone *)
                 this_01.
                 super__Tuple_impl<0UL,_sf2cute::SFPresetZone_*,_std::default_delete<sf2cute::SFPresetZone>_>
                 .super__Head_base<0UL,_sf2cute::SFPresetZone_*,_false>._M_head_impl,pSVar2);
      local_40._M_t.
      super__Tuple_impl<0UL,_sf2cute::SFPresetZone_*,_std::default_delete<sf2cute::SFPresetZone>_>.
      super__Head_base<0UL,_sf2cute::SFPresetZone_*,_false>._M_head_impl =
           (tuple<sf2cute::SFPresetZone_*,_std::default_delete<sf2cute::SFPresetZone>_>)
           (tuple<sf2cute::SFPresetZone_*,_std::default_delete<sf2cute::SFPresetZone>_>)
           this_01.
           super__Tuple_impl<0UL,_sf2cute::SFPresetZone_*,_std::default_delete<sf2cute::SFPresetZone>_>
           .super__Head_base<0UL,_sf2cute::SFPresetZone_*,_false>._M_head_impl;
      std::
      vector<std::unique_ptr<sf2cute::SFPresetZone,std::default_delete<sf2cute::SFPresetZone>>,std::allocator<std::unique_ptr<sf2cute::SFPresetZone,std::default_delete<sf2cute::SFPresetZone>>>>
      ::
      emplace_back<std::unique_ptr<sf2cute::SFPresetZone,std::default_delete<sf2cute::SFPresetZone>>>
                ((vector<std::unique_ptr<sf2cute::SFPresetZone,std::default_delete<sf2cute::SFPresetZone>>,std::allocator<std::unique_ptr<sf2cute::SFPresetZone,std::default_delete<sf2cute::SFPresetZone>>>>
                  *)&this->zones_,
                 (unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_> *)
                 &local_40);
      if ((_Tuple_impl<0UL,_sf2cute::SFPresetZone_*,_std::default_delete<sf2cute::SFPresetZone>_>)
          local_40._M_t.
          super__Tuple_impl<0UL,_sf2cute::SFPresetZone_*,_std::default_delete<sf2cute::SFPresetZone>_>
          .super__Head_base<0UL,_sf2cute::SFPresetZone_*,_false>._M_head_impl != (SFPresetZone *)0x0
         ) {
        (**(code **)(*(long *)local_40._M_t.
                              super__Tuple_impl<0UL,_sf2cute::SFPresetZone_*,_std::default_delete<sf2cute::SFPresetZone>_>
                              .super__Head_base<0UL,_sf2cute::SFPresetZone_*,_false>._M_head_impl +
                    8))();
      }
      puVar6 = puVar6 + 1;
    } while (puVar6 != puVar3);
  }
  SetBackwardReferences(this);
  return;
}

Assistant:

SFPreset::SFPreset(const SFPreset & origin) :
    name_(origin.name_),
    preset_number_(origin.preset_number_),
    bank_(origin.bank_),
    library_(origin.library_),
    genre_(origin.genre_),
    morphology_(origin.morphology_),
    zones_(),
    global_zone_(nullptr),
    parent_file_(nullptr) {
  // Copy global zone.
  if (origin.has_global_zone()) {
    global_zone_ = std::make_unique<SFPresetZone>(origin.global_zone());
  }

  // Copy preset zones.
  zones_.reserve(origin.zones().size());
  for (const auto & zone : origin.zones()) {
    zones_.push_back(std::make_unique<SFPresetZone>(*zone));
  }

  // Repair references.
  SetBackwardReferences();
}